

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O1

void Kernel::SortHelper::collectVariableSortsIter
               (CollectTask task,
               DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *map,
               bool ignoreBound)

{
  uint *puVar1;
  uint uVar2;
  Term *this;
  uint64_t uVar3;
  Formula *pFVar4;
  Symbol *this_00;
  CollectTask *pCVar5;
  bool bVar6;
  uint uVar7;
  int *res;
  TermList TVar8;
  undefined7 extraout_var;
  OperatorType *pOVar9;
  ulong uVar10;
  socklen_t sVar11;
  OperatorKey *pOVar12;
  anon_union_8_4_8765d89c_for_CollectTask_1 *paVar13;
  anon_union_8_4_8765d89c_for_CollectTask_1 aVar14;
  Term *term;
  Term *pTVar15;
  undefined7 in_register_00000031;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar16;
  anon_union_8_2_f154dc0f_for_Term_10 aVar17;
  uint *puVar18;
  MultiCounter bound;
  Substitution subst;
  Stack<Kernel::SortHelper::CollectTask> local_b8;
  undefined4 local_94;
  Array<int> local_90;
  anon_union_8_2_f154dc0f_for_Term_10 *local_78;
  uint *local_70;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *local_68;
  Term *local_60;
  Substitution local_58;
  
  local_94 = (undefined4)CONCAT71(in_register_00000031,ignoreBound);
  local_b8._cursor = (CollectTask *)0x0;
  local_b8._end = (CollectTask *)0x0;
  local_b8._capacity = 0;
  local_b8._stack = (CollectTask *)0x0;
  local_90._vptr_Array = (_func_int **)&PTR_fillInterval_00b63a60;
  local_90._capacity = 0x1f;
  local_68 = map;
  local_90._array = (int *)::operator_new(0x80,0x10);
  local_90._array[0x1b] = 0;
  local_90._array[0x1c] = 0;
  local_90._array[0x1d] = 0;
  local_90._array[0x1e] = 0;
  local_90._array[0x18] = 0;
  local_90._array[0x19] = 0;
  local_90._array[0x1a] = 0;
  local_90._array[0x1b] = 0;
  local_90._array[0x14] = 0;
  local_90._array[0x15] = 0;
  local_90._array[0x16] = 0;
  local_90._array[0x17] = 0;
  local_90._array[0x10] = 0;
  local_90._array[0x11] = 0;
  local_90._array[0x12] = 0;
  local_90._array[0x13] = 0;
  local_90._array[0xc] = 0;
  local_90._array[0xd] = 0;
  local_90._array[0xe] = 0;
  local_90._array[0xf] = 0;
  local_90._array[8] = 0;
  local_90._array[9] = 0;
  local_90._array[10] = 0;
  local_90._array[0xb] = 0;
  local_90._array[4] = 0;
  local_90._array[5] = 0;
  local_90._array[6] = 0;
  local_90._array[7] = 0;
  local_90._array[0] = 0;
  local_90._array[1] = 0;
  local_90._array[2] = 0;
  local_90._array[3] = 0;
  local_90._vptr_Array = (_func_int **)&PTR_fillInterval_00b67948;
  if (local_90._capacity != 0) {
    memset(local_90._array,0,local_90._capacity << 2);
  }
  if (local_b8._cursor == local_b8._end) {
    ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
  }
  ((local_b8._cursor)->contextSort)._content = task.contextSort._content;
  (local_b8._cursor)->fncTag = task.fncTag;
  *(undefined4 *)&(local_b8._cursor)->field_0x4 = task._4_4_;
  *(undefined4 *)&(local_b8._cursor)->field_1 = task.field_1.ts._content._0_4_;
  *(undefined4 *)((long)&(local_b8._cursor)->field_1 + 4) = task.field_1.ts._content._4_4_;
  pCVar5 = local_b8._cursor + 1;
switchD_005d3152_default:
  do {
    local_b8._cursor = pCVar5;
    if (local_b8._cursor == local_b8._stack) {
      ::Lib::Array<int>::~Array(&local_90);
      if (local_b8._stack != (CollectTask *)0x0) {
        uVar10 = local_b8._capacity * 0x18 + 0xf & 0xfffffffffffffff0;
        if (uVar10 == 0) {
          *(undefined8 *)local_b8._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_b8._stack;
        }
        else if (uVar10 < 0x11) {
          *(undefined8 *)local_b8._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_b8._stack;
        }
        else if (uVar10 < 0x19) {
          *(undefined8 *)local_b8._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_b8._stack;
        }
        else if (uVar10 < 0x21) {
          *(undefined8 *)local_b8._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_b8._stack;
        }
        else if (uVar10 < 0x31) {
          *(undefined8 *)local_b8._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_b8._stack;
        }
        else if (uVar10 < 0x41) {
          *(undefined8 *)local_b8._stack = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_b8._stack;
        }
        else {
          operator_delete(local_b8._stack,0x10);
        }
      }
      return;
    }
    pCVar5 = local_b8._cursor + -1;
  } while (UNBIND < local_b8._cursor[-1].fncTag);
  pTVar15 = local_b8._cursor[-1].field_1.t;
  switch(local_b8._cursor[-1].fncTag) {
  case COLLECT_TERM:
    uVar7 = *(uint *)&pTVar15->field_0xc & 0xfffffff;
    aVar17 = *(anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar15->_args + uVar7);
    if ((aVar17._vars & 3) != 2) {
      paVar16 = (anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar15->_args + ((ulong)uVar7 - 1));
      uVar7 = 0;
      local_b8._cursor = pCVar5;
      do {
        TVar8 = getArgSort(pTVar15,uVar7);
        if (local_b8._cursor == local_b8._end) {
          ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
        }
        (local_b8._cursor)->fncTag = COLLECT_TERMLIST;
        ((local_b8._cursor)->field_1).ts._content = (uint64_t)aVar17;
        ((local_b8._cursor)->contextSort)._content = TVar8._content;
        local_b8._cursor = local_b8._cursor + 1;
        aVar17 = *paVar16;
        paVar16 = paVar16 + -1;
        uVar7 = uVar7 + 1;
        pCVar5 = local_b8._cursor;
      } while ((aVar17._vars & 3) != 2);
    }
    goto switchD_005d3152_default;
  case COLLECT_TERMLIST:
    TVar8._content = local_b8._cursor[-1].contextSort._content;
    if (((uint)pTVar15 & 3) == 1) {
      uVar7 = (uint)((ulong)pTVar15 >> 2);
      local_b8._cursor = pCVar5;
      if ((char)local_94 != '\0') {
        uVar10 = (ulong)(int)uVar7;
        if (local_90._capacity <= uVar10) {
          ::Lib::Array<int>::expandToFit(&local_90,uVar10);
        }
        pCVar5 = local_b8._cursor;
        if (local_90._array[uVar10] != 0) goto switchD_005d3152_default;
      }
      ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                (local_68,uVar7,TVar8);
      pCVar5 = local_b8._cursor;
      goto switchD_005d3152_default;
    }
    if (((ulong)pTVar15 & 3) != 0) goto switchD_005d3152_default;
    uVar7 = pTVar15->_functor;
    local_b8._cursor = pCVar5;
    if (pCVar5 == local_b8._end) {
      ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
    }
    (local_b8._cursor)->fncTag = (uint)(0xfffffff8 < uVar7) * 2;
    ((local_b8._cursor)->field_1).t = pTVar15;
    ((local_b8._cursor)->contextSort)._content = TVar8._content;
    break;
  case COLLECT_SPECIALTERM:
    if (0xfffffff8 < pTVar15->_functor) {
      puVar1 = &pTVar15[-1]._functor;
      switch(pTVar15->_functor) {
      case 0xfffffff9:
        goto switchD_005d310e_caseD_fffffff9;
      case 0xfffffffa:
        aVar14 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)&pTVar15[-1]._functor;
        TVar8._content = pTVar15[-1]._args[0]._content;
        local_b8._cursor = pCVar5;
        if (pCVar5 == local_b8._end) {
          ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
        }
        (local_b8._cursor)->fncTag = COLLECT_TERMLIST;
        (local_b8._cursor)->field_1 = aVar14;
LAB_005d390a:
        ((local_b8._cursor)->contextSort)._content = TVar8._content;
        goto LAB_005d390e;
      case 0xfffffffb:
        local_78 = *(anon_union_8_2_f154dc0f_for_Term_10 **)&pTVar15[-1]._maxRedLen;
        local_58._map._timestamp = 1;
        local_58._map._20_8_ = 0;
        local_58._map._28_8_ = 0;
        local_58._map._size = 0;
        local_58._map._deleted = 0;
        local_58._map._capacityIndex = 0;
        local_58._map._capacity = 0;
        local_58._map._afterLast._4_4_ = 0;
        puVar18 = *(uint **)&pTVar15[-1]._weight;
        local_b8._cursor = pCVar5;
        local_70 = puVar1;
        pOVar9 = Signature::Symbol::fnType
                           (*(Symbol **)
                             (*(long *)(DAT_00b7e1b0 + 0x60) + (ulong)pTVar15[-1]._functor * 8));
        pOVar12 = pOVar9->_key;
        if ((pOVar9->_typeArgsArity - 1) + *(int *)pOVar12 == 0) goto LAB_005d3420;
        uVar7 = 0;
        goto LAB_005d3382;
      case 0xfffffffc:
        aVar14 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)puVar1;
        local_b8._cursor = pCVar5;
        if (pCVar5 == local_b8._end) {
          ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
        }
        (local_b8._cursor)->fncTag = COLLECT_TERM;
        goto LAB_005d36c4;
      case 0xfffffffd:
        aVar14 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)puVar1;
        local_b8._cursor = pCVar5;
        if (pCVar5 == local_b8._end) {
          ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
        }
        goto LAB_005d36b9;
      case 0xffffffff:
        local_b8._cursor = pCVar5;
        (*(code *)(&DAT_0091cd60 + *(int *)(&DAT_0091cd60 + (ulong)~pTVar15->_functor * 4)))();
        return;
      }
      this = *(Term **)&pTVar15[-1]._maxRedLen;
      if (((ulong)this & 3) == 0) {
        local_b8._cursor = pCVar5;
        bVar6 = Term::isBoolean(this);
        uVar7 = (uint)CONCAT71(extraout_var,bVar6);
      }
      else {
        uVar7 = 0;
        local_b8._cursor = pCVar5;
      }
      this_00 = *(Symbol **)
                 (*(long *)((ulong)((uVar7 & 0xff) << 5) + 0x60 + DAT_00b7e1b0) +
                 (ulong)pTVar15[-1]._functor * 8);
      puVar18 = *(uint **)&pTVar15[-1]._weight;
      local_58._map._timestamp = 1;
      local_58._map._20_8_ = 0;
      local_58._map._28_8_ = 0;
      local_58._map._size = 0;
      local_58._map._deleted = 0;
      local_58._map._capacityIndex = 0;
      local_58._map._capacity = 0;
      local_58._map._afterLast._4_4_ = 0;
      local_78 = (anon_union_8_2_f154dc0f_for_Term_10 *)CONCAT44(local_78._4_4_,uVar7);
      local_60 = this;
      if ((char)uVar7 == '\0') {
        local_70 = puVar1;
        pOVar9 = Signature::Symbol::fnType(this_00);
      }
      else {
        local_70 = puVar1;
        pOVar9 = Signature::Symbol::predType(this_00);
      }
      pOVar12 = pOVar9->_key;
      if ((pOVar9->_typeArgsArity - 1) + *(int *)pOVar12 == 0) goto LAB_005d37f6;
      uVar7 = 0;
      goto LAB_005d3758;
    }
    goto switchD_005d3152_default;
  case COLLECT_FORMULA:
    switch(*(undefined4 *)&pTVar15->_vptr_Term) {
    case 0:
      pFVar4 = (Formula *)pTVar15->_args[0]._content;
      local_b8._cursor = pCVar5;
      if (*(int *)((long)&(pFVar4->_label)._M_dataplus._M_p + 4) < 0) {
        aVar14 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)((long)&(pFVar4->_label).field_2 + 8)
        ;
        TVar8 = AtomicSort::superSort();
        if (local_b8._cursor == local_b8._end) {
          ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
        }
        (local_b8._cursor)->fncTag = COLLECT_TERMLIST;
        (local_b8._cursor)->field_1 = aVar14;
        ((local_b8._cursor)->contextSort)._content = TVar8._content;
        local_b8._cursor = local_b8._cursor + 1;
      }
      if (local_b8._cursor == local_b8._end) {
        ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
      }
      (local_b8._cursor)->fncTag = COLLECT_TERM;
      ((local_b8._cursor)->field_1).f = pFVar4;
      goto LAB_005d36c8;
    case 1:
    case 2:
      paVar13 = (anon_union_8_4_8765d89c_for_CollectTask_1 *)pTVar15->_args[0]._content;
      local_b8._cursor = pCVar5;
      while (pCVar5 = local_b8._cursor, paVar13 != (anon_union_8_4_8765d89c_for_CollectTask_1 *)0x0)
      {
        aVar14 = *paVar13;
        paVar13 = (anon_union_8_4_8765d89c_for_CollectTask_1 *)paVar13[1].t;
        if (local_b8._cursor == local_b8._end) {
          ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
        }
        (local_b8._cursor)->fncTag = COLLECT_FORMULA;
        (local_b8._cursor)->field_1 = aVar14;
        ((local_b8._cursor)->contextSort)._content = 2;
        local_b8._cursor = local_b8._cursor + 1;
      }
      goto switchD_005d3152_default;
    case 3:
    case 4:
    case 5:
      aVar14 = (anon_union_8_4_8765d89c_for_CollectTask_1)pTVar15->_args[0]._content;
      local_b8._cursor = pCVar5;
      if (pCVar5 == local_b8._end) {
        ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
      }
      (local_b8._cursor)->fncTag = COLLECT_FORMULA;
      (local_b8._cursor)->field_1 = aVar14;
      ((local_b8._cursor)->contextSort)._content = 2;
      local_b8._cursor = local_b8._cursor + 1;
      aVar14 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)(pTVar15 + 1);
      if (local_b8._cursor == local_b8._end) {
        ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
      }
      break;
    case 6:
      aVar14 = (anon_union_8_4_8765d89c_for_CollectTask_1)pTVar15->_args[0]._content;
      local_b8._cursor = pCVar5;
      if (pCVar5 == local_b8._end) {
        ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
      }
      break;
    case 7:
    case 8:
      local_b8._cursor = pCVar5;
      if ((char)local_94 != '\0') {
        aVar14 = (anon_union_8_4_8765d89c_for_CollectTask_1)pTVar15->_args[0]._content;
        if (pCVar5 == local_b8._end) {
          ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
        }
        (local_b8._cursor)->fncTag = UNBIND;
        (local_b8._cursor)->field_1 = aVar14;
        ((local_b8._cursor)->contextSort)._content = 2;
        local_b8._cursor = local_b8._cursor + 1;
      }
      aVar14 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)&pTVar15[1]._functor;
      if (local_b8._cursor == local_b8._end) {
        ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
      }
      (local_b8._cursor)->fncTag = COLLECT_FORMULA;
      (local_b8._cursor)->field_1 = aVar14;
      ((local_b8._cursor)->contextSort)._content = 2;
      local_b8._cursor = local_b8._cursor + 1;
      pCVar5 = local_b8._cursor;
      if ((char)local_94 != '\0') {
        aVar14 = (anon_union_8_4_8765d89c_for_CollectTask_1)pTVar15->_args[0]._content;
        if (local_b8._cursor == local_b8._end) {
          ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
        }
        (local_b8._cursor)->fncTag = BIND;
        goto LAB_005d36c4;
      }
      goto switchD_005d3152_default;
    case 9:
      pTVar15 = (Term *)pTVar15->_args[0]._content;
      if (((ulong)pTVar15 & 1) == 0) {
        uVar7 = pTVar15->_functor;
        local_b8._cursor = pCVar5;
        TVar8 = AtomicSort::boolSort();
        if (local_b8._cursor == local_b8._end) {
          ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
        }
        (local_b8._cursor)->fncTag = (uint)(0xfffffff8 < uVar7) * 2;
        ((local_b8._cursor)->field_1).t = pTVar15;
        goto LAB_005d390a;
      }
      local_b8._cursor = pCVar5;
      if ((char)local_94 != '\0') {
        uVar10 = (ulong)(int)((ulong)pTVar15 >> 2);
        if (local_90._capacity <= uVar10) {
          ::Lib::Array<int>::expandToFit(&local_90,uVar10);
        }
        pCVar5 = local_b8._cursor;
        if (local_90._array[uVar10] != 0) goto switchD_005d3152_default;
      }
      TVar8 = AtomicSort::boolSort();
      ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                (local_68,(uint)((ulong)pTVar15 >> 2),TVar8);
      pCVar5 = local_b8._cursor;
      goto switchD_005d3152_default;
    default:
      goto switchD_005d3152_default;
    }
LAB_005d36b9:
    (local_b8._cursor)->fncTag = COLLECT_FORMULA;
LAB_005d36c4:
    (local_b8._cursor)->field_1 = aVar14;
LAB_005d36c8:
    ((local_b8._cursor)->contextSort)._content = 2;
    break;
  case BIND:
    while (local_b8._cursor = pCVar5, pCVar5 = local_b8._cursor, pTVar15 != (Term *)0x0) {
      uVar10 = (ulong)*(int *)&pTVar15->_vptr_Term;
      pTVar15 = *(Term **)&pTVar15->_functor;
      if (local_90._capacity <= uVar10) {
        ::Lib::Array<int>::expandToFit(&local_90,uVar10);
      }
      local_90._array[uVar10] = local_90._array[uVar10] + 1;
      pCVar5 = local_b8._cursor;
    }
    goto switchD_005d3152_default;
  case UNBIND:
    while (local_b8._cursor = pCVar5, pCVar5 = local_b8._cursor, pTVar15 != (Term *)0x0) {
      uVar10 = (ulong)*(int *)&pTVar15->_vptr_Term;
      pTVar15 = *(Term **)&pTVar15->_functor;
      if (local_90._capacity <= uVar10) {
        ::Lib::Array<int>::expandToFit(&local_90,uVar10);
      }
      local_90._array[uVar10] = local_90._array[uVar10] + -1;
      pCVar5 = local_b8._cursor;
    }
    goto switchD_005d3152_default;
  }
LAB_005d390e:
  pCVar5 = local_b8._cursor + 1;
  goto switchD_005d3152_default;
LAB_005d3758:
  sVar11 = (socklen_t)pOVar12;
  uVar2 = *puVar18;
  uVar10 = (ulong)(int)uVar2;
  puVar18 = *(uint **)(puVar18 + 2);
  TVar8 = AtomicSort::superSort();
  if (uVar7 < pOVar9->_typeArgsArity) {
    Kernel::Substitution::bind
              (&local_58,uVar7 & 0x3fffffff,(sockaddr *)(ulong)(uVar2 * 4 + 1),sVar11);
  }
  else {
    TVar8 = SubstHelper::applyImpl<false,Kernel::Substitution>
                      (*(uint64_t *)(pOVar9->_key + (ulong)(uVar7 - pOVar9->_typeArgsArity) * 8 + 8)
                       ,&local_58,false);
  }
  if ((char)local_94 == '\0') {
LAB_005d37cc:
    ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (local_68,uVar2,TVar8);
  }
  else {
    if (local_90._capacity <= uVar10) {
      ::Lib::Array<int>::expandToFit(&local_90,uVar10);
    }
    if (local_90._array[uVar10] == 0) goto LAB_005d37cc;
  }
  uVar7 = uVar7 + 1;
  pOVar12 = (OperatorKey *)(ulong)*(uint *)pOVar9->_key;
  if ((pOVar9->_typeArgsArity + *(uint *)pOVar9->_key) - 1 <= uVar7) {
LAB_005d37f6:
    (*(code *)(&DAT_0091cd44 + *(int *)(&DAT_0091cd44 + (ulong)~pTVar15->_functor * 4)))();
    return;
  }
  goto LAB_005d3758;
LAB_005d3382:
  sVar11 = (socklen_t)pOVar12;
  uVar2 = *puVar18;
  uVar10 = (ulong)(int)uVar2;
  puVar18 = *(uint **)(puVar18 + 2);
  TVar8 = AtomicSort::superSort();
  if (uVar7 < pOVar9->_typeArgsArity) {
    Kernel::Substitution::bind
              (&local_58,uVar7 & 0x3fffffff,(sockaddr *)(ulong)(uVar2 * 4 + 1),sVar11);
  }
  else {
    TVar8 = SubstHelper::applyImpl<false,Kernel::Substitution>
                      (*(uint64_t *)(pOVar9->_key + (ulong)(uVar7 - pOVar9->_typeArgsArity) * 8 + 8)
                       ,&local_58,false);
  }
  if ((char)local_94 == '\0') {
LAB_005d33f6:
    ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
              (local_68,uVar2,TVar8);
  }
  else {
    if (local_90._capacity <= uVar10) {
      ::Lib::Array<int>::expandToFit(&local_90,uVar10);
    }
    if (local_90._array[uVar10] == 0) goto LAB_005d33f6;
  }
  uVar7 = uVar7 + 1;
  pOVar12 = (OperatorKey *)(ulong)*(uint *)pOVar9->_key;
  if ((pOVar9->_typeArgsArity + *(uint *)pOVar9->_key) - 1 <= uVar7) {
LAB_005d3420:
    (*(code *)(&DAT_0091cd28 + *(int *)(&DAT_0091cd28 + (ulong)~pTVar15->_functor * 4)))();
    return;
  }
  goto LAB_005d3382;
switchD_005d310e_caseD_fffffff9:
  uVar3._0_4_ = pTVar15[-1]._weight;
  uVar3._4_4_ = pTVar15[-1]._kboWeight;
  aVar14 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)
            (pTVar15->_args + (*(uint *)&pTVar15->field_0xc & 0xfffffff));
  local_b8._cursor = pCVar5;
  local_70 = puVar1;
  if (pCVar5 == local_b8._end) {
    ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
  }
  (local_b8._cursor)->fncTag = COLLECT_TERMLIST;
  (local_b8._cursor)->field_1 = aVar14;
  ((local_b8._cursor)->contextSort)._content = uVar3;
  local_b8._cursor = local_b8._cursor + 1;
  uVar7 = *(uint *)&pTVar15->field_0xc & 0xfffffff;
  pCVar5 = local_b8._cursor;
  if (1 < uVar7) {
    local_60 = (Term *)&pTVar15[-1]._weight;
    local_78 = &pTVar15[-1].field_9;
    aVar14 = *(anon_union_8_4_8765d89c_for_CollectTask_1 *)(pTVar15->_args + ((ulong)uVar7 - 1));
    if (local_b8._cursor == local_b8._end) {
      ::Lib::Stack<Kernel::SortHelper::CollectTask>::expand(&local_b8);
    }
    (local_b8._cursor)->fncTag = COLLECT_TERMLIST;
    (local_b8._cursor)->field_1 = aVar14;
    ((local_b8._cursor)->contextSort)._content = uVar3;
    local_b8._cursor = local_b8._cursor + 1;
    (*(code *)(&DAT_0091cd0c + *(int *)(&DAT_0091cd0c + (ulong)~pTVar15->_functor * 4)))();
    return;
  }
  goto switchD_005d3152_default;
}

Assistant:

void SortHelper::collectVariableSortsIter(CollectTask task, DHMap<unsigned,TermList>& map, bool ignoreBound)
{
  Stack<CollectTask> todo;
  MultiCounter bound;

  todo.push(task);
  while (todo.isNonEmpty()) {
    CollectTask task = todo.pop();

    switch(task.fncTag) {
      case COLLECT_TERM: {
        Term* term = task.t;
    
        unsigned position = 0;
        for (TermList* ts = term->args(); ts->isNonEmpty(); ts = ts->next()) {
          CollectTask newTask(COLLECT_TERMLIST);
          newTask.ts = *ts;
          newTask.contextSort = getArgSort(term, position++);
          todo.push(newTask);
        }

      } break;

      case COLLECT_TERMLIST: {
        TermList ts = task.ts;

        if (ts.isTerm()) {
          Term* term = ts.term();

          CollectTask newTask(term->isSpecial() ? COLLECT_SPECIALTERM : COLLECT_TERM);
          newTask.t = term;
          newTask.contextSort = task.contextSort;
          todo.push(newTask);
        } else if (ts.isOrdinaryVar()) {
          unsigned var = ts.var();
          if (!ignoreBound || !bound.get(var)) {
            if (!map.insert(var, task.contextSort)) {
              ASS_EQ(task.contextSort, map.get(var));
            }
          }
        }

      } break;

      case COLLECT_SPECIALTERM: {
        Term* term = task.t;

        ASS(term->isSpecial());

        Term::SpecialTermData* sd = term->getSpecialData();

        switch (term->specialFunctor()) {
          case SpecialFunctor::ITE: {
            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();

            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.ts = *term->nthArgument(1);
            todo.push(newTask);

            newTask.fncTag = COLLECT_FORMULA;
            newTask.f = sd->getCondition();
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::LET: {
            TermList binding = sd->getBinding();
            bool isPredicate = binding.isTerm() && binding.term()->isBoolean();
            Signature::Symbol* symbol = isPredicate ? env.signature->getPredicate(sd->getFunctor())
                                                    : env.signature->getFunction(sd->getFunctor());
            VList::Iterator vit(sd->getVariables());
            Substitution subst;
            auto type = isPredicate ? symbol->predType() : symbol->fnType();
            for (unsigned i = 0; i < type->arity(); i++) {
              ASS(vit.hasNext());
              auto var = vit.next();
              TermList sort = AtomicSort::superSort();
              if (i < type->numTypeArguments()) {
                subst.bind(type->quantifiedVar(i).var(), TermList(var, false));
              } else {
                sort = SubstHelper::apply(type->arg(i),subst);
              }
              if (!ignoreBound || !bound.get(var)) {
                if (!map.insert(var, sort)) {
                  ASS_EQ(sort, map.get(var));
                }
              }
            }

            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();

            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.ts = binding;
            if (!isPredicate) {
              newTask.contextSort = SubstHelper::apply(type->result(),subst);
            }
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::LET_TUPLE: {
            TermList binding = sd->getBinding();
            Signature::Symbol* symbol = env.signature->getFunction(sd->getFunctor());
            Substitution subst;
            VList::Iterator vit(sd->getTupleSymbols());
            auto type = symbol->fnType();
            for (unsigned i = 0; i < type->arity(); i++) {
              ASS(vit.hasNext());
              auto var = vit.next();
              TermList sort = AtomicSort::superSort();
              if (i < type->numTypeArguments()) {
                subst.bind(type->quantifiedVar(i).var(), TermList(var, false));
              } else {
                sort = SubstHelper::apply(type->arg(i),subst);
              }
              if (!ignoreBound || !bound.get(var)) {
                if (!map.insert(var, sort)) {
                  ASS_EQ(sort, map.get(var));
                }
              }
            }

            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();
            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.contextSort = SubstHelper::apply(type->result(),subst);
            newTask.ts = binding;
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::FORMULA: {
            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = sd->getFormula();
            todo.push(newTask);
          } break;
          case SpecialFunctor::LAMBDA: {
            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getLambdaExpSort();
            newTask.ts = sd->getLambdaExp();
            todo.push(newTask);
          } break;

          case SpecialFunctor::TUPLE: {
            CollectTask newTask(COLLECT_TERM);
            newTask.t = sd->getTupleTerm();
            todo.push(newTask);
          } break;

          case SpecialFunctor::MATCH: {
            CollectTask newTask(COLLECT_TERMLIST);
            auto matchedSort = term->getSpecialData()->getMatchedSort();

            // there are two sorts here, one is the sort
            // of matched term and patterns, the other is
            // the sort of the match block and of each case
            newTask.ts = *term->nthArgument(0);
            newTask.contextSort = matchedSort;
            todo.push(newTask);
            for (unsigned int i = 1; i < term->arity(); i += 2) {
              newTask.ts = *term->nthArgument(i);
              newTask.contextSort = matchedSort;
              todo.push(newTask);

              newTask.ts = *term->nthArgument(i + 1);
              newTask.contextSort = sd->getSort();
              todo.push(newTask);
            }
            break;
          }
        }
      } break;

      case COLLECT_FORMULA: {
        Formula* f = task.f;

        switch (f->connective()) {
          case LITERAL: {
            Literal* lit = f->literal();
            if(lit->isTwoVarEquality()){
              CollectTask newTask(COLLECT_TERMLIST);
              newTask.ts = lit->twoVarEqSort();
              newTask.contextSort = AtomicSort::superSort();
              todo.push(newTask);
            }
            CollectTask newTask(COLLECT_TERM);
            newTask.t = lit;

            todo.push(newTask);
            break;
          }

          case BOOL_TERM: {
            TermList ts = f->getBooleanTerm();
            if (ts.isVar()) {
              if (!ignoreBound || !bound.get(ts.var())) {
                if (!map.insert(ts.var(), AtomicSort::boolSort())) {
                  ASS_EQ(AtomicSort::boolSort(), map.get(ts.var()));
                }
              }
            } else {
              ASS(ts.isTerm());

              CollectTask newTask(ts.term()->isSpecial() ? COLLECT_SPECIALTERM : COLLECT_TERM);
              newTask.t = ts.term();
              newTask.contextSort = AtomicSort::boolSort();

              todo.push(newTask);
            }
            break;
          }

          case EXISTS:
          case FORALL: {
            if (ignoreBound) {
              CollectTask unbindTask(UNBIND);
              unbindTask.vars = f->vars();
              todo.push(unbindTask);
            }

            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = f->qarg();
            todo.push(newTask);

            if (ignoreBound) {
              CollectTask bindTask(BIND);
              bindTask.vars = f->vars();
              todo.push(bindTask);
            }
            break;
          }

          case AND:
          case OR: {
            FormulaList::Iterator argIt(f->args());
            while (argIt.hasNext()) {
              CollectTask newTask(COLLECT_FORMULA);
              newTask.f = argIt.next();
              todo.push(newTask);
            }
            break;
          }

          case IMP:
          case IFF:
          case XOR: {
            CollectTask leftTask(COLLECT_FORMULA);
            leftTask.f = f->left();
            todo.push(leftTask);

            CollectTask rightTask(COLLECT_FORMULA);
            rightTask.f = f->right();
            todo.push(rightTask);
            break;
          }

          case NOT: {
            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = f->uarg();
            todo.push(newTask);
            break;
          }

          default:
            continue;
        }
      } break;

      case BIND: {
        VList::Iterator vit(task.vars);
        while (vit.hasNext()) {
          bound.inc(vit.next());
        }
      } break;

      case UNBIND: {
        VList::Iterator vit(task.vars);
        while (vit.hasNext()) {
          bound.dec(vit.next());
        }
      } break;
    }
  }
}